

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcdata_op.cc
# Opt level: O0

PcodeOp * earliestUseInBlock(Varnode *vn,BlockBasic *bl)

{
  PcodeOp *this;
  PcodeOp *pPVar1;
  bool bVar2;
  uintm uVar3;
  uintm uVar4;
  reference ppPVar5;
  BlockBasic *pBVar6;
  SeqNum *pSVar7;
  PcodeOp *op;
  _List_node_base *local_30;
  PcodeOp *local_28;
  PcodeOp *res;
  const_iterator iter;
  BlockBasic *bl_local;
  Varnode *vn_local;
  
  iter._M_node = (_List_node_base *)bl;
  std::_List_const_iterator<PcodeOp_*>::_List_const_iterator
            ((_List_const_iterator<PcodeOp_*> *)&res);
  local_28 = (PcodeOp *)0x0;
  local_30 = (_List_node_base *)Varnode::beginDescend(vn);
  res = (PcodeOp *)local_30;
  while( true ) {
    op = (PcodeOp *)Varnode::endDescend(vn);
    bVar2 = std::operator!=((_Self *)&res,(_Self *)&op);
    if (!bVar2) break;
    ppPVar5 = std::_List_const_iterator<PcodeOp_*>::operator*
                        ((_List_const_iterator<PcodeOp_*> *)&res);
    this = *ppPVar5;
    pBVar6 = PcodeOp::getParent(this);
    pPVar1 = local_28;
    if ((pBVar6 == (BlockBasic *)iter._M_node) && (pPVar1 = this, local_28 != (PcodeOp *)0x0)) {
      pSVar7 = PcodeOp::getSeqNum(this);
      uVar3 = SeqNum::getOrder(pSVar7);
      pSVar7 = PcodeOp::getSeqNum(local_28);
      uVar4 = SeqNum::getOrder(pSVar7);
      pPVar1 = local_28;
      if (uVar3 < uVar4) {
        pPVar1 = this;
      }
    }
    local_28 = pPVar1;
    std::_List_const_iterator<PcodeOp_*>::operator++((_List_const_iterator<PcodeOp_*> *)&res);
  }
  return local_28;
}

Assistant:

PcodeOp *earliestUseInBlock(Varnode *vn,BlockBasic *bl)

{
  list<PcodeOp *>::const_iterator iter;
  PcodeOp *res = (PcodeOp *)0;

  for(iter=vn->beginDescend();iter!=vn->endDescend();++iter) {
    PcodeOp *op = *iter;
    if (op->getParent() != bl) continue;
    if (res == (PcodeOp *)0)
      res = op;
    else {
      if (op->getSeqNum().getOrder() < res->getSeqNum().getOrder())
	res = op;
    }
  }
  return res;
}